

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

bool __thiscall ON_PolyCurve::ChangeClosedCurveSeam(ON_PolyCurve *this,double t)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  double *pdVar5;
  ON_Curve **ppOVar6;
  double dVar7;
  double dVar8;
  int local_134;
  double d;
  int j;
  undefined1 local_e0 [8];
  ON_SimpleArray<double> new_t;
  ON_SimpleArray<ON_Curve_*> new_c;
  double segt;
  ON_Interval Segdom;
  double nt;
  ON_Interval subdom;
  ON_Curve *sright;
  ON_Curve *sleft;
  int new_count;
  int segment_index;
  double s_1;
  double k;
  double s;
  ON_Interval sdom;
  ON_Curve *scrv;
  ON_Interval old_dom;
  int old_count;
  bool rc;
  double t_local;
  ON_PolyCurve *this_local;
  
  uVar3 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x34])();
  old_dom.m_t[1]._7_1_ = (byte)uVar3 & 1;
  if ((uVar3 & 1) != 0) {
    (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x17])();
    old_dom.m_t[1]._7_1_ = 0;
    old_dom.m_t[1]._0_4_ = Count(this);
    (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
    sdom.m_t[1] = 0.0;
    if (old_dom.m_t[1]._0_4_ == 1) {
      sdom.m_t[1] = (double)SegmentCurve(this,0);
      if ((ON_Curve *)sdom.m_t[1] != (ON_Curve *)0x0) {
        (*(((ON_Curve *)sdom.m_t[1])->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
        k = ON_Interval::TransformParameterTo((ON_Interval *)&scrv,(ON_Interval *)&s,t);
        bVar1 = (**(code **)(*(long *)sdom.m_t[1] + 0x138))(k);
        old_dom.m_t[1]._7_1_ = bVar1 & 1;
        if (old_dom.m_t[1]._7_1_ != 0) {
          dVar7 = ON_Interval::Length((ON_Interval *)&scrv);
          (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
                    (t,t + dVar7);
        }
      }
    }
    else {
      s_1 = t;
      bVar2 = ON_Interval::Includes((ON_Interval *)&scrv,t,false);
      if (!bVar2) {
        _new_count = ON_Interval::NormalizedParameterAt((ON_Interval *)&scrv,t);
        _new_count = fmod(_new_count,1.0);
        if (_new_count < 0.0) {
          _new_count = _new_count + 1.0;
        }
        s_1 = ON_Interval::ParameterAt((ON_Interval *)&scrv,_new_count);
      }
      bVar2 = ON_Interval::Includes((ON_Interval *)&scrv,s_1,true);
      if (bVar2) {
        iVar4 = old_dom.m_t[1]._0_4_ + 1;
        pdVar5 = ON_SimpleArray<double>::Array(&this->m_t);
        sleft._4_4_ = ON_NurbsSpanIndex(2,iVar4,pdVar5,s_1,0,0);
        ppOVar6 = ON_SimpleArray<ON_Curve_*>::operator[]
                            (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,sleft._4_4_);
        dVar7 = s_1;
        sdom.m_t[1] = (double)*ppOVar6;
        pdVar5 = ON_SimpleArray<double>::operator[](&this->m_t,sleft._4_4_);
        dVar8 = s_1;
        if (dVar7 < *pdVar5) {
          return false;
        }
        pdVar5 = ON_SimpleArray<double>::operator[](&this->m_t,sleft._4_4_ + 1);
        dVar7 = s_1;
        if (*pdVar5 <= dVar8) {
          return false;
        }
        pdVar5 = ON_SimpleArray<double>::operator[](&this->m_t,sleft._4_4_);
        if ((dVar7 != *pdVar5) || (NAN(dVar7) || NAN(*pdVar5))) {
          local_134 = old_dom.m_t[1]._0_4_ + 1;
        }
        else {
          local_134 = old_dom.m_t[1]._0_4_;
        }
        sleft._0_4_ = local_134;
        sright = (ON_Curve *)0x0;
        subdom.m_t[1] = 0.0;
        if (old_dom.m_t[1]._0_4_ < local_134) {
          pdVar5 = ON_SimpleArray<double>::operator[](&this->m_t,sleft._4_4_);
          dVar7 = *pdVar5;
          pdVar5 = ON_SimpleArray<double>::operator[](&this->m_t,sleft._4_4_ + 1);
          dVar8 = *pdVar5;
          ON_Interval::ON_Interval((ON_Interval *)&nt,dVar7,dVar8);
          Segdom.m_t[1] = ON_Interval::NormalizedParameterAt((ON_Interval *)&nt,s_1);
          segt = (double)(**(code **)(*(long *)sdom.m_t[1] + 0x128))();
          Segdom.m_t[0] = dVar8;
          dVar7 = ON_Interval::ParameterAt((ON_Interval *)&segt,Segdom.m_t[1]);
          bVar1 = (**(code **)(*(long *)sdom.m_t[1] + 0x1f0))
                            (dVar7,sdom.m_t[1],&sright,subdom.m_t + 1);
          old_dom.m_t[1]._7_1_ = bVar1 & 1;
          if (old_dom.m_t[1]._7_1_ == 0) {
            if (0.5 < Segdom.m_t[1]) {
              sleft._4_4_ = sleft._4_4_ + 1;
              if ((int)sleft._4_4_ < old_dom.m_t[1]._0_4_) {
                ppOVar6 = ON_SimpleArray<ON_Curve_*>::operator[]
                                    (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,sleft._4_4_
                                    );
                sdom.m_t[1] = (double)*ppOVar6;
              }
              else {
                sdom.m_t[1] = 0.0;
              }
            }
            sleft._0_4_ = (int)sleft + -1;
          }
        }
        if ((int)sleft == old_dom.m_t[1]._0_4_) {
          subdom.m_t[1] = sdom.m_t[1];
          sdom.m_t[1] = 0.0;
          old_dom.m_t[1]._7_1_ = 1;
        }
        if (((old_dom.m_t[1]._7_1_ & 1) != 0) && ((int)sleft._4_4_ < old_dom.m_t[1]._0_4_)) {
          ppOVar6 = ON_SimpleArray<ON_Curve_*>::operator[]
                              (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,sleft._4_4_);
          *ppOVar6 = (ON_Curve *)0x0;
          ON_SimpleArray<ON_Curve_*>::ON_SimpleArray
                    ((ON_SimpleArray<ON_Curve_*> *)&new_t.m_count,(long)(int)sleft);
          ON_SimpleArray<double>::ON_SimpleArray
                    ((ON_SimpleArray<double> *)local_e0,(long)((int)sleft + 1));
          ON_SimpleArray<ON_Curve_*>::Append
                    ((ON_SimpleArray<ON_Curve_*> *)&new_t.m_count,(ON_Curve **)(subdom.m_t + 1));
          ON_SimpleArray<double>::Append((ON_SimpleArray<double> *)local_e0,&s_1);
          iVar4 = ~sleft._4_4_ + old_dom.m_t[1]._0_4_;
          ppOVar6 = ON_SimpleArray<ON_Curve_*>::Array
                              (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>);
          ON_SimpleArray<ON_Curve_*>::Append
                    ((ON_SimpleArray<ON_Curve_*> *)&new_t.m_count,iVar4,
                     ppOVar6 + (long)(int)sleft._4_4_ + 1);
          iVar4 = ~sleft._4_4_ + old_dom.m_t[1]._0_4_;
          pdVar5 = ON_SimpleArray<double>::Array(&this->m_t);
          ON_SimpleArray<double>::Append
                    ((ON_SimpleArray<double> *)local_e0,iVar4,pdVar5 + (long)(int)sleft._4_4_ + 1);
          d._0_4_ = ON_SimpleArray<double>::Count((ON_SimpleArray<double> *)local_e0);
          uVar3 = sleft._4_4_;
          ppOVar6 = ON_SimpleArray<ON_Curve_*>::Array
                              (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>);
          ON_SimpleArray<ON_Curve_*>::Append
                    ((ON_SimpleArray<ON_Curve_*> *)&new_t.m_count,uVar3,ppOVar6);
          uVar3 = sleft._4_4_;
          pdVar5 = ON_SimpleArray<double>::Array(&this->m_t);
          ON_SimpleArray<double>::Append((ON_SimpleArray<double> *)local_e0,uVar3,pdVar5);
          if (sright != (ON_Curve *)0x0) {
            ON_SimpleArray<ON_Curve_*>::Append((ON_SimpleArray<ON_Curve_*> *)&new_t.m_count,&sright)
            ;
            pdVar5 = ON_SimpleArray<double>::operator[](&this->m_t,sleft._4_4_);
            ON_SimpleArray<double>::Append((ON_SimpleArray<double> *)local_e0,pdVar5);
          }
          ON_SimpleArray<double>::Append((ON_SimpleArray<double> *)local_e0,&s_1);
          dVar7 = ON_Interval::Length((ON_Interval *)&scrv);
          for (; iVar4 = ON_SimpleArray<double>::Count((ON_SimpleArray<double> *)local_e0),
              d._0_4_ < iVar4; d._0_4_ = d._0_4_ + 1) {
            pdVar5 = ON_SimpleArray<double>::operator[]((ON_SimpleArray<double> *)local_e0,d._0_4_);
            *pdVar5 = dVar7 + *pdVar5;
          }
          ppOVar6 = ON_SimpleArray<ON_Curve_*>::Array
                              (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>);
          iVar4 = ON_SimpleArray<ON_Curve_*>::Capacity
                            (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>);
          memset(ppOVar6,0,(long)iVar4 << 3);
          ON_SimpleArray<ON_Curve_*>::SetCount
                    (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,0);
          iVar4 = ON_SimpleArray<ON_Curve_*>::Count((ON_SimpleArray<ON_Curve_*> *)&new_t.m_count);
          ppOVar6 = ON_SimpleArray<ON_Curve_*>::Array((ON_SimpleArray<ON_Curve_*> *)&new_t.m_count);
          ON_SimpleArray<ON_Curve_*>::Append
                    (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,iVar4,ppOVar6);
          ON_SimpleArray<double>::operator=(&this->m_t,(ON_SimpleArray<double> *)local_e0);
          if (sdom.m_t[1] != 0.0) {
            if (sdom.m_t[1] != 0.0) {
              (**(code **)(*(long *)sdom.m_t[1] + 0x20))();
            }
            sdom.m_t[1] = 0.0;
          }
          ON_SimpleArray<double>::~ON_SimpleArray((ON_SimpleArray<double> *)local_e0);
          ON_SimpleArray<ON_Curve_*>::~ON_SimpleArray((ON_SimpleArray<ON_Curve_*> *)&new_t.m_count);
        }
      }
      else {
        old_dom.m_t[1]._7_1_ = 1;
      }
      if ((old_dom.m_t[1]._7_1_ & 1) != 0) {
        dVar7 = ON_Interval::Length((ON_Interval *)&scrv);
        (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
                  (t,t + dVar7);
      }
    }
  }
  return (bool)(old_dom.m_t[1]._7_1_ & 1);
}

Assistant:

bool ON_PolyCurve::ChangeClosedCurveSeam( double t )
{
  bool rc = IsClosed();
  if ( rc )
  {
  	DestroyRuntimeCache();
    rc = false;
    const int old_count = Count();
    const ON_Interval old_dom = Domain();
    ON_Curve* scrv = 0;
    if ( old_count == 1 )
    {
      scrv = SegmentCurve(0);
      if ( scrv )
      {
        ON_Interval sdom = scrv->Domain();
        double s = old_dom.TransformParameterTo(sdom, t);
        rc = scrv->ChangeClosedCurveSeam(s);
        if ( rc )
          SetDomain( t, t + old_dom.Length() );
      }
    }
    else
    {
      double k = t;
      if ( !old_dom.Includes(t) )
      {
        double s = old_dom.NormalizedParameterAt(t);
        s = fmod(s,1.0);
        if ( s < 0.0 )
          s += 1.0;
        k = old_dom.ParameterAt(s);
      }
      if ( old_dom.Includes(k,true) )
      {
        int segment_index = ON_NurbsSpanIndex(2,old_count+1,m_t.Array(),k,0,0);
        scrv = m_segment[segment_index];
        if ( k < m_t[segment_index] )
          return false;
        if ( k >= m_t[segment_index+1] )
          return false;
        int new_count = (k==m_t[segment_index]) ? old_count : old_count+1;
        ON_Curve* sleft = 0;
        ON_Curve* sright = 0;
        if ( new_count > old_count )
        {
					ON_Interval subdom(m_t[segment_index], m_t[segment_index+1]);
					double nt = subdom.NormalizedParameterAt(k);
					ON_Interval Segdom = scrv->Domain();
					double segt = Segdom.ParameterAt(nt);
          rc = scrv->Split( segt, sleft, sright );

//				Greg Arden 6 May 2003. Fixes TRR#10332.  If split fails we break the
//				curve between segments and adjust the parameterization
					if(!rc){
						if(nt>.5){
							segment_index++;
							if(segment_index<old_count)
								scrv = m_segment[segment_index];		
							else
								scrv = nullptr;
						}
						new_count--;
					}
        }
        if(new_count==old_count)
        {
          sright = scrv;
          scrv = 0;
          rc = true;
        }
        if ( rc && segment_index<old_count)
        {
          m_segment[segment_index] = 0;//todo
          ON_SimpleArray<ON_Curve*> new_c(new_count);
          ON_SimpleArray<double> new_t(new_count+1);
          new_c.Append(sright);
          new_t.Append(k);
          new_c.Append( old_count-segment_index-1, m_segment.Array()+segment_index+1);
          new_t.Append( old_count-segment_index-1, m_t.Array()+segment_index+1);
          int j = new_t.Count();
          new_c.Append( segment_index, m_segment.Array() );
          new_t.Append( segment_index, m_t.Array() );
          if ( sleft )
          {
            new_c.Append(sleft);
            new_t.Append(m_t[segment_index]);
          }
          new_t.Append(k);
          double d = old_dom.Length();
          while (j < new_t.Count() )
          {
            new_t[j] += d;
            j++;
          }

          // take care when moving new_c pointers to m_segment
          // so that we don't delete any curves.
          memset( m_segment.Array(), 0, m_segment.Capacity()*sizeof( *m_segment.Array() ) );
          m_segment.SetCount(0);
          m_segment.Append( new_c.Count(), new_c.Array() );
          m_t = new_t;
          if ( scrv )
          {
            delete scrv;
            scrv = 0;
          }
        }
      }
      else
      {
        // k is already the start or  end of the existing curve
        rc = true;
      }
      if ( rc )
        SetDomain( t, t + old_dom.Length() );
    }
  }
  return rc;
}